

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visitObject(PostResolutionChecks *this,Statement *t)

{
  Statement *pSVar1;
  bool bVar2;
  uint uVar3;
  Expression *pEVar4;
  CompileMessage local_a8;
  CompileMessage local_70;
  pool_ptr<soul::AST::Expression> local_28;
  pool_ptr<soul::AST::Expression> local_20;
  pool_ptr<soul::AST::Expression> e;
  Statement *t_local;
  PostResolutionChecks *this_local;
  
  e.object = (Expression *)t;
  cast<soul::AST::Expression,soul::AST::Statement>((soul *)&local_20,t);
  bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_20);
  if (bVar2) {
    local_28.object = local_20.object;
    bVar2 = AST::isResolvedAsType(&local_28);
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_28);
    if (bVar2) {
      pSVar1 = &(e.object)->super_Statement;
      Errors::expectedStatement<>();
      AST::Context::throwError(&(pSVar1->super_ASTObject).context,&local_70,false);
    }
    pEVar4 = pool_ptr<soul::AST::Expression>::operator->(&local_20);
    uVar3 = (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[0xe])();
    if ((uVar3 & 1) != 0) {
      pSVar1 = &(e.object)->super_Statement;
      Errors::expressionHasNoEffect<>();
      AST::Context::throwError(&(pSVar1->super_ASTObject).context,&local_a8,false);
    }
  }
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_20);
  ASTVisitor::visitObject(&this->super_ASTVisitor,&(e.object)->super_Statement);
  return;
}

Assistant:

void visitObject (AST::Statement& t) override
        {
            if (auto e = cast<AST::Expression> (t))
            {
                if (AST::isResolvedAsType (e))
                    t.context.throwError (Errors::expectedStatement());

                if (e->isCompileTimeConstant())
                    t.context.throwError (Errors::expressionHasNoEffect());
            }

            super::visitObject (t);
        }